

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearSystem.cpp
# Opt level: O0

void __thiscall iDynTree::optimalcontrol::LinearSystem::~LinearSystem(LinearSystem *this)

{
  pointer puVar1;
  LinearSystemPimpl *in_RDI;
  
  (in_RDI->stateMatrix).
  super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)&PTR__LinearSystem_003fa6d0;
  if ((in_RDI->stateSparsity).m_nonZeroElementRows.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    puVar1 = (in_RDI->stateSparsity).m_nonZeroElementRows.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (puVar1 != (pointer)0x0) {
      LinearSystemPimpl::~LinearSystemPimpl(in_RDI);
      operator_delete(puVar1,0xf8);
    }
    (in_RDI->stateSparsity).m_nonZeroElementRows.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
  }
  DynamicalSystem::~DynamicalSystem((DynamicalSystem *)in_RDI);
  return;
}

Assistant:

LinearSystem::~LinearSystem()
        {
            if(m_pimpl){
                delete m_pimpl;
                m_pimpl = nullptr;
            }
        }